

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  uint8_t *puVar1;
  uint uVar2;
  ulong uVar3;
  LogMessageFatal local_30;
  
  puVar1 = EnsureSpace(this,ptr);
  if (puVar1 < this->end_) {
    puVar1 = puVar1 + 2;
    for (uVar2 = num * 8 + 2; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar1[-2] = (byte)uVar2 | 0x80;
      puVar1 = puVar1 + 1;
    }
    puVar1[-2] = (byte)uVar2;
    uVar3 = s._M_len & 0xffffffff;
    while( true ) {
      if ((uint)uVar3 < 0x80) break;
      puVar1[-1] = (byte)uVar3 | 0x80;
      uVar3 = (ulong)((uint)uVar3 >> 7);
      puVar1 = puVar1 + 1;
    }
    puVar1[-1] = (byte)uVar3;
    puVar1 = WriteRaw(this,s._M_str,(int)s._M_len,puVar1);
    return puVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
             ,0x355,"ptr < end_");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num,
                                                 absl::string_view s,
                                                 uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}